

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BeginDockableDragDropSource(ImGuiWindow *window)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiContext *pIVar4;
  ImGuiWindow *pIVar5;
  bool bVar6;
  ImU32 IVar7;
  ImGuiContext *g;
  long lVar8;
  ImGuiWindow *local_28;
  
  pIVar4 = GImGui;
  if (GImGui->ActiveId != window->MoveId) {
    __assert_fail("g.ActiveId == window->MoveId",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3eca,"void ImGui::BeginDockableDragDropSource(ImGuiWindow *)");
  }
  if (GImGui->MovingWindow != window) {
    __assert_fail("g.MovingWindow == window",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3ecb,"void ImGui::BeginDockableDragDropSource(ImGuiWindow *)");
  }
  if (GImGui->CurrentWindow != window) {
    __assert_fail("g.CurrentWindow == window",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3ecc,"void ImGui::BeginDockableDragDropSource(ImGuiWindow *)");
  }
  (GImGui->LastItemData).ID = GImGui->ActiveId;
  local_28 = window->RootWindowDockTree;
  if ((local_28->Flags & 0x200000) == 0) {
    if ((((pIVar4->IO).ConfigDockingWithShift != false) ||
        ((((fVar1 = (pIVar4->ActiveIdClickOffset).x, 0.0 <= fVar1 &&
           (fVar2 = (pIVar4->Style).FramePadding.y, fVar3 = (pIVar4->ActiveIdClickOffset).y,
           fVar3 < fVar2 + fVar2 + pIVar4->FontSize)) && (0.0 <= fVar3)) &&
         (fVar1 < (local_28->SizeFull).x)))) && (bVar6 = BeginDragDropSource(0x25), bVar6)) {
      lVar8 = 0;
      SetDragDropPayload("_IMWINDOW",&local_28,8,0);
      EndDragDropSource();
      pIVar5 = local_28;
      do {
        IVar7 = ColorConvertFloat4ToU32
                          ((pIVar4->Style).Colors + *(int *)((long)GWindowDockStyleColors + lVar8));
        *(ImU32 *)((long)(pIVar5->DockStyle).Colors + lVar8) = IVar7;
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0x18);
    }
    return;
  }
  __assert_fail("(window->Flags & ImGuiWindowFlags_NoDocking) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0x3ed0,"void ImGui::BeginDockableDragDropSource(ImGuiWindow *)");
}

Assistant:

void ImGui::BeginDockableDragDropSource(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.ActiveId == window->MoveId);
    IM_ASSERT(g.MovingWindow == window);
    IM_ASSERT(g.CurrentWindow == window);

    g.LastItemData.ID = window->MoveId;
    window = window->RootWindowDockTree;
    IM_ASSERT((window->Flags & ImGuiWindowFlags_NoDocking) == 0);
    bool is_drag_docking = (g.IO.ConfigDockingWithShift) || ImRect(0, 0, window->SizeFull.x, GetFrameHeight()).Contains(g.ActiveIdClickOffset); // FIXME-DOCKING: Need to make this stateful and explicit
    if (is_drag_docking && BeginDragDropSource(ImGuiDragDropFlags_SourceNoPreviewTooltip | ImGuiDragDropFlags_SourceNoHoldToOpenOthers | ImGuiDragDropFlags_SourceAutoExpirePayload))
    {
        SetDragDropPayload(IMGUI_PAYLOAD_TYPE_WINDOW, &window, sizeof(window));
        EndDragDropSource();

        // Store style overrides
        for (int color_n = 0; color_n < ImGuiWindowDockStyleCol_COUNT; color_n++)
            window->DockStyle.Colors[color_n] = ColorConvertFloat4ToU32(g.Style.Colors[GWindowDockStyleColors[color_n]]);
    }
}